

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O1

void write_sei_rbsp(h264_stream_t *h,bs_t *b)

{
  h264_stream_t *h_00;
  long lVar1;
  
  h_00 = h;
  if (0 < h->num_seis) {
    lVar1 = 0;
    do {
      h->sei = h->seis[lVar1];
      h_00 = h;
      write_sei_message(h,b);
      lVar1 = lVar1 + 1;
    } while (lVar1 < h->num_seis);
  }
  h->sei = (sei_t *)0x0;
  write_rbsp_trailing_bits(h_00,b);
  return;
}

Assistant:

void write_sei_rbsp(h264_stream_t* h, bs_t* b)
{
    int i;
    for (i = 0; i < h->num_seis; i++)
    {
        h->sei = h->seis[i];
        write_sei_message(h, b);
    }
    //since hei is temp, let seis list free what needs to be freed
    //and leave sei null
    h->sei = NULL;
    write_rbsp_trailing_bits(h, b);
}